

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void __thiscall fmt::v9::detail::utf8_to_utf16::utf8_to_utf16(utf8_to_utf16 *this,string_view s)

{
  wchar_t *pwVar1;
  size_t sVar2;
  char *buf_ptr;
  char *pcVar3;
  char *buf_ptr_00;
  char *pcVar4;
  char *ptr;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar5;
  size_t __n;
  anon_class_8_1_54a39806 decode;
  char acStack_48 [8];
  anon_class_8_1_54a39806 local_40;
  wchar_t *local_38;
  
  pcVar4 = (char *)s.size_;
  pcVar5 = s.data_;
  buf_ptr_00 = acStack_48;
  (this->buffer_).super_buffer<wchar_t>.ptr_ = (wchar_t *)0x0;
  (this->buffer_).super_buffer<wchar_t>.size_ = 0;
  (this->buffer_).super_buffer<wchar_t>._vptr_buffer = (_func_int **)&PTR_grow_002d6730;
  local_38 = (this->buffer_).store_;
  (this->buffer_).super_buffer<wchar_t>.ptr_ = local_38;
  (this->buffer_).super_buffer<wchar_t>.capacity_ = 500;
  pcVar3 = pcVar5;
  local_40.f.this = (anon_class_8_1_8991fb9c_for_f)(anon_class_8_1_8991fb9c_for_f)this;
  if ((char *)0x3 < pcVar4) {
    ptr = pcVar4;
    do {
      buf_ptr = pcVar3;
      pcVar3 = buf_ptr;
      if (pcVar5 + (long)pcVar4 + -3 <= buf_ptr) goto LAB_0022d2b3;
      pcVar3 = for_each_codepoint<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/fmt-src/include/fmt/format-inl.h:1438:25)>
               ::anon_class_8_1_54a39806::operator()(&local_40,buf_ptr,ptr);
      ptr = extraout_RDX;
    } while (pcVar3 != (char *)0x0);
    pcVar3 = (char *)0x0;
LAB_0022d2b3:
    if (buf_ptr < pcVar5 + (long)pcVar4 + -3) goto LAB_0022d2ff;
  }
  __n = (long)(pcVar5 + (long)pcVar4) - (long)pcVar3;
  if (__n != 0) {
    acStack_48[4] = '\0';
    acStack_48[5] = '\0';
    acStack_48[6] = '\0';
    acStack_48[0] = '\0';
    acStack_48[1] = '\0';
    acStack_48[2] = '\0';
    acStack_48[3] = '\0';
    if ((long)__n < 0) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/fmt-src/include/fmt/core.h"
                  ,0x199,"negative value");
    }
    memcpy(acStack_48,pcVar3,__n);
    pcVar3 = extraout_RDX_00;
    do {
      buf_ptr_00 = for_each_codepoint<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/fmt-src/include/fmt/format-inl.h:1438:25)>
                   ::anon_class_8_1_54a39806::operator()(&local_40,buf_ptr_00,pcVar3);
      if (buf_ptr_00 == (char *)0x0) break;
      pcVar3 = extraout_RDX_01;
    } while ((long)buf_ptr_00 - (long)acStack_48 < (long)__n);
  }
LAB_0022d2ff:
  if ((this->buffer_).super_buffer<wchar_t>.capacity_ <
      (this->buffer_).super_buffer<wchar_t>.size_ + 1) {
    (**(this->buffer_).super_buffer<wchar_t>._vptr_buffer)(this);
  }
  pwVar1 = (this->buffer_).super_buffer<wchar_t>.ptr_;
  sVar2 = (this->buffer_).super_buffer<wchar_t>.size_;
  (this->buffer_).super_buffer<wchar_t>.size_ = sVar2 + 1;
  pwVar1[sVar2] = L'\0';
  return;
}

Assistant:

FMT_FUNC detail::utf8_to_utf16::utf8_to_utf16(string_view s) {
  for_each_codepoint(s, [this](uint32_t cp, string_view) {
    if (cp == invalid_code_point) FMT_THROW(std::runtime_error("invalid utf8"));
    if (cp <= 0xFFFF) {
      buffer_.push_back(static_cast<wchar_t>(cp));
    } else {
      cp -= 0x10000;
      buffer_.push_back(static_cast<wchar_t>(0xD800 + (cp >> 10)));
      buffer_.push_back(static_cast<wchar_t>(0xDC00 + (cp & 0x3FF)));
    }
    return true;
  });
  buffer_.push_back(0);
}